

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

float_specs
fmt::v7::detail::parse_float_type_spec<fmt::v7::detail::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  error_handler *eh_local;
  basic_format_specs<char> *specs_local;
  float_specs result;
  
  bVar3 = -((char)specs->field_0x9 >> 7);
  specs_local = (basic_format_specs<char> *)((ulong)bVar3 << 0x34);
  cVar1 = specs->type;
  if (cVar1 == '\0') {
    specs_local = (basic_format_specs<char> *)((ulong)(bVar3 != 0 || 0 < specs->precision) << 0x34);
    return (float_specs)specs_local;
  }
  if (cVar1 == 'A') {
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
LAB_0011ed2d:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x300000000);
  }
  else {
    if (cVar1 == 'E') {
      specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
LAB_0011ec74:
      uVar2 = (uint)((ulong)specs_local >> 0x20);
      specs_local = (basic_format_specs<char> *)
                    ((ulong)(uVar2 & 0xffefffff | 1 |
                            (uint)(uVar2 >> 0x14 != 0 || specs->precision != 0) << 0x14) << 0x20);
      return (float_specs)specs_local;
    }
    if (cVar1 == 'F') {
      specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
    }
    else {
      if (cVar1 == 'G') {
        specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
        return (float_specs)specs_local;
      }
      if (cVar1 == 'L') {
        specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x2000000000000);
        return (float_specs)specs_local;
      }
      if (cVar1 == 'a') goto LAB_0011ed2d;
      if (cVar1 == 'e') goto LAB_0011ec74;
      if (cVar1 != 'f') {
        if (cVar1 == 'g') {
          return (float_specs)specs_local;
        }
        error_handler::on_error(eh,"invalid type specifier");
      }
    }
    uVar2 = (uint)((ulong)specs_local >> 0x20);
    specs_local = (basic_format_specs<char> *)
                  ((ulong)(uVar2 & 0xffefffff | 2 |
                          (uint)(uVar2 >> 0x14 != 0 || specs->precision != 0) << 0x14) << 0x20);
  }
  return (float_specs)specs_local;
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.showpoint = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.showpoint |= specs.precision > 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}